

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_copy_constructor_Test::TestBody(VectorSUnitTest_copy_constructor_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  reference pvVar4;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_12c0;
  AssertHelper local_1260;
  Message local_1258;
  allocator<char> local_1249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar_23;
  Message local_1210;
  allocator<char> local_1201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1200;
  undefined1 local_11e0 [8];
  AssertionResult gtest_ar_22;
  Message local_11c8;
  allocator<char> local_11b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  undefined1 local_1198 [8];
  AssertionResult gtest_ar_21;
  Message local_1180;
  allocator<char> local_1171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1170;
  undefined1 local_1150 [8];
  AssertionResult gtest_ar_20;
  Message local_1138;
  allocator<char> local_1129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  undefined1 local_1108 [8];
  AssertionResult gtest_ar_19;
  Message local_10f0;
  size_type local_10e8;
  uint local_10dc;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_10a8;
  Message local_10a0;
  bool local_1091;
  undefined1 local_1090 [8];
  AssertionResult gtest_ar__3;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
  vs_diff_capacity_move;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ee8;
  undefined1 local_ee0 [8];
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  v_src_move_diff_capacity;
  Message local_d88;
  allocator<char> local_d79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d78;
  undefined1 local_d58 [8];
  AssertionResult gtest_ar_17;
  Message local_d40;
  allocator<char> local_d31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  undefined1 local_d10 [8];
  AssertionResult gtest_ar_16;
  Message local_cf8;
  allocator<char> local_ce9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  undefined1 local_cc8 [8];
  AssertionResult gtest_ar_15;
  Message local_cb0;
  allocator<char> local_ca1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_14;
  Message local_c68;
  allocator<char> local_c59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  undefined1 local_c38 [8];
  AssertionResult gtest_ar_13;
  Message local_c20;
  size_type local_c18;
  uint local_c0c;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_bd8;
  Message local_bd0;
  bool local_bc1;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar__2;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
  vs_diff_capacity;
  Message local_a18;
  allocator<char> local_a09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_11;
  Message local_9d0;
  allocator<char> local_9c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_10;
  Message local_988;
  allocator<char> local_979;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_9;
  Message local_940;
  allocator<char> local_931;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_8;
  Message local_8f8;
  allocator<char> local_8e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_7;
  Message local_8b0;
  size_type local_8a8;
  uint local_89c;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_868;
  Message local_860;
  bool local_851;
  undefined1 local_850 [8];
  AssertionResult gtest_ar__1;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  vs_move;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e8;
  undefined1 local_6e0 [8];
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  v_src_move;
  Message local_588;
  allocator<char> local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_5;
  Message local_540;
  allocator<char> local_531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_4;
  Message local_4f8;
  allocator<char> local_4e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_3;
  Message local_4b0;
  allocator<char> local_4a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_2;
  Message local_468;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_1;
  Message local_420;
  size_type local_418;
  uint local_40c;
  undefined1 local_408 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3d8;
  Message local_3d0;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL> vs
  ;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  undefined1 local_250 [8];
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  v_src;
  allocator<char> local_f8;
  allocator<char> local_f7;
  allocator<char> local_f6;
  allocator<char> local_f5 [20];
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_raw_src;
  VectorSUnitTest_copy_constructor_Test *this_local;
  
  v_src.data_ptr_._7_1_ = 1;
  local_e0 = &local_d8;
  v_raw_src.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"0",&local_e1);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"1",local_f5);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"2",&local_f6);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"3",&local_f7);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"4",&local_f8);
  v_src.data_ptr_._7_1_ = 0;
  local_38 = &local_d8;
  local_30 = 5;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&v_src.data_ptr_ + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&v_src.data_ptr_ + 6));
  local_12c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_12c0 = local_12c0 + -1;
    std::__cxx11::string::~string((string *)local_12c0);
  } while (local_12c0 != &local_d8);
  std::allocator<char>::~allocator(&local_f8);
  std::allocator<char>::~allocator(&local_f7);
  std::allocator<char>::~allocator(&local_f6);
  std::allocator<char>::~allocator(local_f5);
  std::allocator<char>::~allocator(&local_e1);
  local_258._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  vs.data_ptr_ = (pointer)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_28);
  estl::vector_s<std::__cxx11::string,10ul>::
  vector_s<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)local_250,&local_258,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs.data_ptr_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
            *)&gtest_ar_.message_,
           (vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
            *)local_250);
  local_3c1 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::empty((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                       *)&gtest_ar_.message_);
  local_3c1 = !local_3c1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3c0,(AssertionResult *)"vs.empty()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_40c = 5;
  local_418 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::size((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                      *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_408,"5u","vs.size()",&local_40c,&local_418);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"0",&local_459);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_438,"std::string(\"0\")","vs[0]",&local_458,pvVar3);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"1",&local_4a1);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_480,"std::string(\"1\")","vs[1]",&local_4a0,pvVar3);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"2",&local_4e9);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,2);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4c8,"std::string(\"2\")","vs[2]",&local_4e8,pvVar3);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"3",&local_531);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_510,"std::string(\"3\")","vs[3]",&local_530,pvVar3);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"4",&local_579);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_558,"std::string(\"4\")","vs[4]",&local_578,pvVar3);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move.data_ptr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v_src_move.data_ptr_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move.data_ptr_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  local_6e8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  vs_move.data_ptr_ =
       (pointer)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_28);
  estl::vector_s<std::__cxx11::string,10ul>::
  vector_s<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)local_6e0,&local_6e8,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_move.data_ptr_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
            *)&gtest_ar__1.message_,
           (vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
            *)local_6e0);
  local_851 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::empty((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                       *)&gtest_ar__1.message_);
  local_851 = !local_851;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_850,&local_851,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_850,
               (AssertionResult *)"vs_move.empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
  local_89c = 5;
  local_8a8 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::size((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                      *)&gtest_ar__1.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_898,"5u","vs_move.size()",&local_89c,&local_8a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"0",&local_8e9);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar__1.message_,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_8c8,"std::string(\"0\")","vs_move[0]",&local_8e8,pvVar3);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"1",&local_931);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar__1.message_,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_910,"std::string(\"1\")","vs_move[1]",&local_930,pvVar3);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator(&local_931);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_940);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"2",&local_979);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar__1.message_,2);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_958,"std::string(\"2\")","vs_move[2]",&local_978,pvVar3);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_958);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"3",&local_9c1);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar__1.message_,3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9a0,"std::string(\"3\")","vs_move[3]",&local_9c0,pvVar3);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator(&local_9c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"4",&local_a09);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar__1.message_,4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9e8,"std::string(\"4\")","vs_move[4]",&local_a08,pvVar3);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar1) {
    testing::Message::Message(&local_a18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vs_diff_capacity.data_ptr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&vs_diff_capacity.data_ptr_,&local_a18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vs_diff_capacity.data_ptr_);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
            ((vector_s<std::__cxx11::string,12ul> *)&gtest_ar__2.message_,
             (vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              *)local_250);
  local_bc1 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
              ::empty((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                       *)&gtest_ar__2.message_);
  local_bc1 = !local_bc1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bc0,&local_bc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_bc0,
               (AssertionResult *)"vs_diff_capacity.empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  local_c0c = 5;
  local_c18 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
              ::size((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                      *)&gtest_ar__2.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c08,"5u","vs_diff_capacity.size()",&local_c0c,&local_c18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c08);
  if (!bVar1) {
    testing::Message::Message(&local_c20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_c20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"0",&local_c59);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__2.message_,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c38,"std::string(\"0\")","vs_diff_capacity[0]",&local_c58,pvVar4);
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator(&local_c59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c38);
  if (!bVar1) {
    testing::Message::Message(&local_c68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_c68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_c68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca0,"1",&local_ca1);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__2.message_,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c80,"std::string(\"1\")","vs_diff_capacity[1]",&local_ca0,pvVar4);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::allocator<char>::~allocator(&local_ca1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(&local_cb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce8,"2",&local_ce9);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__2.message_,2);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_cc8,"std::string(\"2\")","vs_diff_capacity[2]",&local_ce8,pvVar4);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::allocator<char>::~allocator(&local_ce9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc8);
  if (!bVar1) {
    testing::Message::Message(&local_cf8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d30,"3",&local_d31);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__2.message_,3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d10,"std::string(\"3\")","vs_diff_capacity[3]",&local_d30,pvVar4);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator(&local_d31);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar1) {
    testing::Message::Message(&local_d40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_d40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d78,"4",&local_d79);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__2.message_,4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d58,"std::string(\"4\")","vs_diff_capacity[4]",&local_d78,pvVar4);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d58);
  if (!bVar1) {
    testing::Message::Message(&local_d88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity.data_ptr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity.data_ptr_,&local_d88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity.data_ptr_);
    testing::Message::~Message(&local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d58);
  local_ee8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  vs_diff_capacity_move.data_ptr_ =
       (pointer)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_28);
  estl::vector_s<std::__cxx11::string,10ul>::
  vector_s<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)local_ee0,&local_ee8,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_diff_capacity_move.data_ptr_);
  estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
            ((vector_s<std::__cxx11::string,12ul> *)&gtest_ar__3.message_,
             (vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              *)local_ee0);
  local_1091 = estl::
               vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
               ::empty((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                        *)&gtest_ar__3.message_);
  local_1091 = !local_1091;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1090,&local_1091,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1090);
  if (!bVar1) {
    testing::Message::Message(&local_10a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18.message_,(internal *)local_1090,
               (AssertionResult *)"vs_diff_capacity_move.empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_10a8,&local_10a0);
    testing::internal::AssertHelper::~AssertHelper(&local_10a8);
    std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_10a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1090);
  local_10dc = 5;
  local_10e8 = estl::
               vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
               ::size((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                       *)&gtest_ar__3.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_10d8,"5u","vs_diff_capacity_move.size()",&local_10dc,&local_10e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d8);
  if (!bVar1) {
    testing::Message::Message(&local_10f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_10f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_10f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1128,"0",&local_1129);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__3.message_,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1108,"std::string(\"0\")","vs_diff_capacity_move[0]",&local_1128,
             pvVar4);
  std::__cxx11::string::~string((string *)&local_1128);
  std::allocator<char>::~allocator(&local_1129);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1108);
  if (!bVar1) {
    testing::Message::Message(&local_1138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_1138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_1138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1170,"1",&local_1171);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__3.message_,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1150,"std::string(\"1\")","vs_diff_capacity_move[1]",&local_1170,
             pvVar4);
  std::__cxx11::string::~string((string *)&local_1170);
  std::allocator<char>::~allocator(&local_1171);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1150);
  if (!bVar1) {
    testing::Message::Message(&local_1180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_1180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_1180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11b8,"2",&local_11b9);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__3.message_,2);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1198,"std::string(\"2\")","vs_diff_capacity_move[2]",&local_11b8,
             pvVar4);
  std::__cxx11::string::~string((string *)&local_11b8);
  std::allocator<char>::~allocator(&local_11b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1198);
  if (!bVar1) {
    testing::Message::Message(&local_11c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_11c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_11c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1200,"3",&local_1201);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__3.message_,3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_11e0,"std::string(\"3\")","vs_diff_capacity_move[3]",&local_1200,
             pvVar4);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e0);
  if (!bVar1) {
    testing::Message::Message(&local_1210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_1210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1248,"4",&local_1249);
  pvVar4 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
                         *)&gtest_ar__3.message_,4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1228,"std::string(\"4\")","vs_diff_capacity_move[4]",&local_1248,
             pvVar4);
  std::__cxx11::string::~string((string *)&local_1248);
  std::allocator<char>::~allocator(&local_1249);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1228);
  if (!bVar1) {
    testing::Message::Message(&local_1258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1228);
    testing::internal::AssertHelper::AssertHelper
              (&local_1260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1260,&local_1258);
    testing::internal::AssertHelper::~AssertHelper(&local_1260);
    testing::Message::~Message(&local_1258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1228);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
             *)&gtest_ar__3.message_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)local_ee0);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
             *)&gtest_ar__2.message_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)&gtest_ar__1.message_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)local_6e0);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)&gtest_ar_.message_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, copy_constructor)
{
    std::vector<std::string> v_raw_src{"0","1","2","3","4"};

    vector_s<std::string, 10> v_src(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 10> vs(v_src);
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("0"), vs[0]);
    EXPECT_EQ(std::string("1"), vs[1]);
    EXPECT_EQ(std::string("2"), vs[2]);
    EXPECT_EQ(std::string("3"), vs[3]);
    EXPECT_EQ(std::string("4"), vs[4]);

    vector_s<std::string, 10> v_src_move(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 10> vs_move(std::move(v_src_move));
    EXPECT_FALSE(vs_move.empty());
    EXPECT_EQ(5u, vs_move.size());
    EXPECT_EQ(std::string("0"), vs_move[0]);
    EXPECT_EQ(std::string("1"), vs_move[1]);
    EXPECT_EQ(std::string("2"), vs_move[2]);
    EXPECT_EQ(std::string("3"), vs_move[3]);
    EXPECT_EQ(std::string("4"), vs_move[4]);

    vector_s<std::string, 12> vs_diff_capacity(v_src);
    EXPECT_FALSE(vs_diff_capacity.empty());
    EXPECT_EQ(5u, vs_diff_capacity.size());
    EXPECT_EQ(std::string("0"), vs_diff_capacity[0]);
    EXPECT_EQ(std::string("1"), vs_diff_capacity[1]);
    EXPECT_EQ(std::string("2"), vs_diff_capacity[2]);
    EXPECT_EQ(std::string("3"), vs_diff_capacity[3]);
    EXPECT_EQ(std::string("4"), vs_diff_capacity[4]);

    vector_s<std::string, 10> v_src_move_diff_capacity(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 12> vs_diff_capacity_move(std::move(v_src_move_diff_capacity));
    EXPECT_FALSE(vs_diff_capacity_move.empty());
    EXPECT_EQ(5u, vs_diff_capacity_move.size());
    EXPECT_EQ(std::string("0"), vs_diff_capacity_move[0]);
    EXPECT_EQ(std::string("1"), vs_diff_capacity_move[1]);
    EXPECT_EQ(std::string("2"), vs_diff_capacity_move[2]);
    EXPECT_EQ(std::string("3"), vs_diff_capacity_move[3]);
    EXPECT_EQ(std::string("4"), vs_diff_capacity_move[4]);

}